

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

uint64_t Catch::getEstimatedClockResolution(void)

{
  if (getEstimatedClockResolution()::s_resolution == '\0') {
    getEstimatedClockResolution();
  }
  return getEstimatedClockResolution::s_resolution;
}

Assistant:

auto getEstimatedClockResolution() -> uint64_t {
        static auto s_resolution = estimateClockResolution();
        return s_resolution;
    }